

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O1

bool __thiscall bssl::der::ParseBmpString(der *this,Input in,string *out)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  size_t sVar4;
  string *psVar5;
  bool bVar6;
  uint32_t c;
  CBS cbs;
  ScopedCBB cbb;
  uint32_t local_6c;
  CBS local_68;
  CBB local_58;
  
  psVar5 = (string *)in.data_.size_;
  if (((undefined1  [16])in.data_ & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_68.data = (uint8_t *)this;
    local_68.len = (size_t)in.data_.data_;
    CBB_zero(&local_58);
    iVar1 = CBB_init(&local_58,(size_t)in.data_.data_);
    if (iVar1 == 0) {
LAB_004b4dc8:
      bVar6 = false;
    }
    else {
      if ((uchar *)local_68.len != (uchar *)0x0) {
        do {
          iVar1 = CBS_get_ucs2_be(&local_68,&local_6c);
          if (iVar1 == 0) goto LAB_004b4dc8;
          iVar1 = CBB_add_utf8(&local_58,local_6c);
          if (iVar1 == 0) goto LAB_004b4dc8;
        } while ((uchar *)local_68.len != (uchar *)0x0);
      }
      puVar2 = CBB_data(&local_58);
      puVar3 = CBB_data(&local_58);
      sVar4 = CBB_len(&local_58);
      bVar6 = true;
      ::std::__cxx11::string::_M_replace_dispatch<unsigned_char_const*>
                (psVar5,*(long *)psVar5,*(long *)(psVar5 + 8) + *(long *)psVar5,puVar2,
                 puVar3 + sVar4);
    }
    CBB_cleanup(&local_58);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ParseBmpString(Input in, std::string *out) {
  if (in.size() % 2 != 0) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, in.data(), in.size());
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), in.size())) {
    return false;
  }

  while (CBS_len(&cbs) != 0) {
    uint32_t c;
    if (!CBS_get_ucs2_be(&cbs, &c) ||  //
        !CBB_add_utf8(cbb.get(), c)) {
      return false;
    }
  }

  out->assign(CBB_data(cbb.get()), CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}